

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

void __thiscall
jbcoin::STAmount::STAmount
          (STAmount *this,SField *name,Issue *issue,mantissa_type mantissa,exponent_type exponent,
          bool native,bool negative)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
  uVar1 = *(undefined8 *)((issue->currency).pn + 2);
  uVar2 = *(undefined8 *)((issue->currency).pn + 4);
  uVar3 = *(undefined8 *)((issue->account).pn + 1);
  *(undefined8 *)(this->mIssue).currency.pn = *(undefined8 *)(issue->currency).pn;
  *(undefined8 *)((this->mIssue).currency.pn + 2) = uVar1;
  *(undefined8 *)((this->mIssue).currency.pn + 4) = uVar2;
  *(undefined8 *)((this->mIssue).account.pn + 1) = uVar3;
  *(undefined8 *)((this->mIssue).account.pn + 3) = *(undefined8 *)((issue->account).pn + 3);
  this->mValue = mantissa;
  this->mOffset = exponent;
  this->mIsNative = native;
  this->mIsNegative = negative;
  canonicalize(this);
  return;
}

Assistant:

STAmount::STAmount (SField const& name, Issue const& issue,
        mantissa_type mantissa, exponent_type exponent,
            bool native, bool negative)
    : STBase (name)
    , mIssue (issue)
    , mValue (mantissa)
    , mOffset (exponent)
    , mIsNative (native)
    , mIsNegative (negative)
{
    canonicalize();
}